

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O0

MMAL_PARAM_EXPOSUREMODE_T __thiscall
raspicam::_private::Private_Impl::convertExposure(Private_Impl *this,RASPICAM_EXPOSURE exposure)

{
  RASPICAM_EXPOSURE exposure_local;
  Private_Impl *this_local;
  MMAL_PARAM_EXPOSUREMODE_T local_4;
  
  switch(exposure) {
  case RASPICAM_EXPOSURE_OFF:
    local_4 = MMAL_PARAM_EXPOSUREMODE_OFF;
    break;
  case RASPICAM_EXPOSURE_AUTO:
    local_4 = MMAL_PARAM_EXPOSUREMODE_AUTO;
    break;
  case RASPICAM_EXPOSURE_NIGHT:
    local_4 = MMAL_PARAM_EXPOSUREMODE_NIGHT;
    break;
  case RASPICAM_EXPOSURE_NIGHTPREVIEW:
    local_4 = MMAL_PARAM_EXPOSUREMODE_NIGHTPREVIEW;
    break;
  case RASPICAM_EXPOSURE_BACKLIGHT:
    local_4 = MMAL_PARAM_EXPOSUREMODE_BACKLIGHT;
    break;
  case RASPICAM_EXPOSURE_SPOTLIGHT:
    local_4 = MMAL_PARAM_EXPOSUREMODE_SPOTLIGHT;
    break;
  case RASPICAM_EXPOSURE_SPORTS:
    local_4 = MMAL_PARAM_EXPOSUREMODE_SPORTS;
    break;
  case RASPICAM_EXPOSURE_SNOW:
    local_4 = MMAL_PARAM_EXPOSUREMODE_SNOW;
    break;
  case RASPICAM_EXPOSURE_BEACH:
    local_4 = MMAL_PARAM_EXPOSUREMODE_BEACH;
    break;
  case RASPICAM_EXPOSURE_VERYLONG:
    local_4 = MMAL_PARAM_EXPOSUREMODE_VERYLONG;
    break;
  case RASPICAM_EXPOSURE_FIXEDFPS:
    local_4 = MMAL_PARAM_EXPOSUREMODE_FIXEDFPS;
    break;
  case RASPICAM_EXPOSURE_ANTISHAKE:
    local_4 = MMAL_PARAM_EXPOSUREMODE_ANTISHAKE;
    break;
  case RASPICAM_EXPOSURE_FIREWORKS:
    local_4 = MMAL_PARAM_EXPOSUREMODE_FIREWORKS;
    break;
  default:
    local_4 = MMAL_PARAM_EXPOSUREMODE_AUTO;
  }
  return local_4;
}

Assistant:

MMAL_PARAM_EXPOSUREMODE_T Private_Impl::convertExposure ( RASPICAM_EXPOSURE exposure ) {

            switch ( exposure ) {
            case RASPICAM_EXPOSURE_OFF:
                return MMAL_PARAM_EXPOSUREMODE_OFF;
            case RASPICAM_EXPOSURE_AUTO:
                return MMAL_PARAM_EXPOSUREMODE_AUTO;
            case RASPICAM_EXPOSURE_NIGHT:
                return MMAL_PARAM_EXPOSUREMODE_NIGHT;
            case RASPICAM_EXPOSURE_NIGHTPREVIEW:
                return MMAL_PARAM_EXPOSUREMODE_NIGHTPREVIEW;
            case RASPICAM_EXPOSURE_BACKLIGHT:
                return MMAL_PARAM_EXPOSUREMODE_BACKLIGHT;
            case RASPICAM_EXPOSURE_SPOTLIGHT:
                return MMAL_PARAM_EXPOSUREMODE_SPOTLIGHT;
            case RASPICAM_EXPOSURE_SPORTS:
                return MMAL_PARAM_EXPOSUREMODE_SPORTS;
            case RASPICAM_EXPOSURE_SNOW:
                return MMAL_PARAM_EXPOSUREMODE_SNOW;
            case RASPICAM_EXPOSURE_BEACH:
                return MMAL_PARAM_EXPOSUREMODE_BEACH;
            case RASPICAM_EXPOSURE_VERYLONG:
                return MMAL_PARAM_EXPOSUREMODE_VERYLONG;
            case RASPICAM_EXPOSURE_FIXEDFPS:
                return MMAL_PARAM_EXPOSUREMODE_FIXEDFPS;
            case RASPICAM_EXPOSURE_ANTISHAKE:
                return MMAL_PARAM_EXPOSUREMODE_ANTISHAKE;
            case RASPICAM_EXPOSURE_FIREWORKS:
                return MMAL_PARAM_EXPOSUREMODE_FIREWORKS;
            default:
                return MMAL_PARAM_EXPOSUREMODE_AUTO;
            }
        }